

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point_Cloud.h
# Opt level: O1

uint __thiscall Nova::Point_Cloud<float,_2>::Add_Vertex(Point_Cloud<float,_2> *this,TV *X)

{
  pointer *ppVVar1;
  iterator __position;
  
  __position._M_current =
       (this->points)._data.
       super__Vector_base<Nova::Vector<float,_2,_true>,_std::allocator<Nova::Vector<float,_2,_true>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->points)._data.
      super__Vector_base<Nova::Vector<float,_2,_true>,_std::allocator<Nova::Vector<float,_2,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Nova::Vector<float,2,true>,std::allocator<Nova::Vector<float,2,true>>>::
    _M_realloc_insert<Nova::Vector<float,2,true>const&>
              ((vector<Nova::Vector<float,2,true>,std::allocator<Nova::Vector<float,2,true>>> *)this
               ,__position,X);
  }
  else {
    *(undefined8 *)((__position._M_current)->_data)._M_elems = *(undefined8 *)(X->_data)._M_elems;
    ppVVar1 = &(this->points)._data.
               super__Vector_base<Nova::Vector<float,_2,_true>,_std::allocator<Nova::Vector<float,_2,_true>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppVVar1 = *ppVVar1 + 1;
  }
  return (uint)((ulong)((long)(this->points)._data.
                              super__Vector_base<Nova::Vector<float,_2,_true>,_std::allocator<Nova::Vector<float,_2,_true>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->points)._data.
                             super__Vector_base<Nova::Vector<float,_2,_true>,_std::allocator<Nova::Vector<float,_2,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
}

Assistant:

unsigned Add_Vertex(const TV& X)
    {
        points.Append(X);
        return points.size();
    }